

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O0

int run_test_we_get_signals_mixed(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_26;
  int64_t eval_a_26;
  int64_t eval_b_25;
  int64_t eval_a_25;
  int64_t eval_b_24;
  int64_t eval_a_24;
  int64_t eval_b_23;
  int64_t eval_a_23;
  int64_t eval_b_22;
  int64_t eval_a_22;
  int64_t eval_b_21;
  int64_t eval_a_21;
  int64_t eval_b_20;
  int64_t eval_a_20;
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  timer_ctx tc;
  signal_ctx sc [4];
  
  loop_00 = (uv_loop_t *)uv_default_loop();
  start_timer(loop_00,0x11,(timer_ctx *)&loop);
  start_watcher(loop_00,0x11,(signal_ctx *)&tc.signum,1);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[0].signum,1);
  tc.signum = 0;
  sc[0].signum = 0;
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x102,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)(uint)loop != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x103,"tc.ncalls","==","10",(ulong)(uint)loop,"==",10);
    abort();
  }
  if ((ulong)(uint)tc._132_4_ != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x104,"1","==","sc[0].ncalls",1,"==",(ulong)(uint)tc._132_4_);
    abort();
  }
  if ((ulong)(uint)sc[0].one_shot != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x105,"1","==","sc[1].ncalls",1,"==",(ulong)(uint)sc[0].one_shot);
    abort();
  }
  start_timer(loop_00,0x11,(timer_ctx *)&loop);
  start_watcher(loop_00,0x11,(signal_ctx *)&tc.signum,1);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[0].signum,1);
  tc.signum = 0;
  sc[0].signum = 0;
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[1].signum,0);
  uv_close(sc + 2,0);
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x10f,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)(uint)loop != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x110,"tc.ncalls","==","10",(ulong)(uint)loop,"==",10);
    abort();
  }
  if ((ulong)(uint)tc._132_4_ != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x111,"1","==","sc[0].ncalls",1,"==",(ulong)(uint)tc._132_4_);
    abort();
  }
  if ((ulong)(uint)sc[0].one_shot != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x112,"1","==","sc[1].ncalls",1,"==",(ulong)(uint)sc[0].one_shot);
    abort();
  }
  if ((ulong)(uint)sc[1].one_shot != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x113,"sc[2].ncalls","==","0",(ulong)(uint)sc[1].one_shot,"==",0);
    abort();
  }
  start_timer(loop_00,0x11,(timer_ctx *)&loop);
  start_watcher(loop_00,0x11,(signal_ctx *)&tc.signum,0);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[0].signum,0);
  tc.signum = 0;
  sc[0].signum = 0;
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[1].signum,1);
  uv_close(sc + 2,0);
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x11d,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)(uint)loop != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x11e,"tc.ncalls","==","10",(ulong)(uint)loop,"==",10);
    abort();
  }
  if ((ulong)(uint)tc._132_4_ != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x11f,"sc[0].ncalls","==","10",(ulong)(uint)tc._132_4_,"==",10);
    abort();
  }
  if ((ulong)(uint)sc[0].one_shot != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x120,"sc[1].ncalls","==","10",(ulong)(uint)sc[0].one_shot,"==",10);
    abort();
  }
  if ((ulong)(uint)sc[1].one_shot != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x121,"sc[2].ncalls","==","0",(ulong)(uint)sc[1].one_shot,"==",0);
    abort();
  }
  start_timer(loop_00,0x11,(timer_ctx *)&loop);
  start_watcher(loop_00,0x11,(signal_ctx *)&tc.signum,0);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[0].signum,0);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[1].signum,1);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[2].signum,1);
  sc[1].signum = 0;
  sc[2].signum = 0;
  uv_close(sc,0);
  uv_close(sc + 1,0);
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x12d,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)(uint)loop != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x12e,"tc.ncalls","==","10",(ulong)(uint)loop,"==",10);
    abort();
  }
  if ((ulong)(uint)tc._132_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x12f,"sc[0].ncalls","==","0",(ulong)(uint)tc._132_4_,"==",0);
    abort();
  }
  if ((ulong)(uint)sc[0].one_shot != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x130,"sc[1].ncalls","==","0",(ulong)(uint)sc[0].one_shot,"==",0);
    abort();
  }
  if ((ulong)(uint)sc[1].one_shot != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x131,"1","==","sc[2].ncalls",1,"==",(ulong)(uint)sc[1].one_shot);
    abort();
  }
  if ((ulong)(uint)sc[1].one_shot != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x132,"1","==","sc[2].ncalls",1,"==",(ulong)(uint)sc[1].one_shot);
    abort();
  }
  start_timer(loop_00,0x11,(timer_ctx *)&loop);
  start_watcher(loop_00,0x11,(signal_ctx *)&tc.signum,0);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[0].signum,1);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[1].signum,0);
  start_watcher(loop_00,0x11,(signal_ctx *)&sc[2].signum,0);
  sc[2].signum = 0;
  uv_close(sc,0);
  uv_close(sc + 2,0);
  iVar1 = uv_run(loop_00,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x13d,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)(uint)loop != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x13e,"tc.ncalls","==","10",(ulong)(uint)loop,"==",10);
    abort();
  }
  if ((ulong)(uint)tc._132_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x13f,"sc[0].ncalls","==","0",(ulong)(uint)tc._132_4_,"==",0);
    abort();
  }
  if ((ulong)(uint)sc[0].one_shot != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x140,"1","==","sc[1].ncalls",1,"==",(ulong)(uint)sc[0].one_shot);
    abort();
  }
  if ((ulong)(uint)sc[1].one_shot != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x141,"sc[2].ncalls","==","0",(ulong)(uint)sc[1].one_shot,"==",0);
    abort();
  }
  if ((ulong)(uint)sc[2].one_shot != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x142,"sc[3].ncalls","==","10",(ulong)(uint)sc[2].one_shot,"==",10);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x144,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(we_get_signals_mixed) {
  struct signal_ctx sc[4];
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();

  /* 2 one-shot */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 1);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);

  /* 2 one-shot, 1 normal then remove normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 1);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  start_watcher(loop, SIGCHLD, sc + 2, 0);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);
  ASSERT_OK(sc[2].ncalls);

  /* 2 normal, 1 one-shot then remove one-shot */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 0);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  start_watcher(loop, SIGCHLD, sc + 2, 1);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc[0].ncalls, NSIGNALS);
  ASSERT_EQ(sc[1].ncalls, NSIGNALS);
  ASSERT_OK(sc[2].ncalls);

  /* 2 normal, 2 one-shot then remove 2 normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 0);
  start_watcher(loop, SIGCHLD, sc + 2, 1);
  start_watcher(loop, SIGCHLD, sc + 3, 1);
  sc[2].stop_or_close = CLOSE;
  sc[3].stop_or_close = CLOSE;
  uv_close((uv_handle_t*)&(sc[0]).handle, NULL);
  uv_close((uv_handle_t*)&(sc[1]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_OK(sc[0].ncalls);
  ASSERT_OK(sc[1].ncalls);
  ASSERT_EQ(1, sc[2].ncalls);
  ASSERT_EQ(1, sc[2].ncalls);

  /* 1 normal, 1 one-shot, 2 normal then remove 1st normal, 2nd normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  start_watcher(loop, SIGCHLD, sc + 2, 0);
  start_watcher(loop, SIGCHLD, sc + 3, 0);
  sc[3].stop_or_close = CLOSE;
  uv_close((uv_handle_t*)&(sc[0]).handle, NULL);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_OK(sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);
  ASSERT_OK(sc[2].ncalls);
  ASSERT_EQ(sc[3].ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}